

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQOut.cpp
# Opt level: O0

void __thiscall NaPNQueueOutput::action(NaPNQueueOutput *this)

{
  NaReal NVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  NaVector *pNVar5;
  undefined4 extraout_var;
  NaReal *pNVar6;
  undefined4 extraout_var_00;
  long *in_RDI;
  uint i;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  NaPetriCnInput *in_stack_ffffffffffffffc8;
  uint local_c;
  
  if ((int)in_RDI[0x15] == 0) {
    local_c = 0;
    while (uVar2 = local_c, uVar4 = (**(code **)(*in_RDI + 0xa8))(), uVar2 < uVar4) {
      pNVar5 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
      iVar3 = (*pNVar5->_vptr_NaVector[8])(pNVar5,(ulong)local_c);
      NVar1 = *(NaReal *)CONCAT44(extraout_var_00,iVar3);
      pNVar6 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),
                          (uint)((ulong)NVar1 >> 0x20));
      *pNVar6 = NVar1;
      local_c = local_c + 1;
    }
  }
  else {
    pNVar5 = (NaVector *)(in_RDI + 0x12);
    uVar2 = NaVector::dim((NaVector *)(in_RDI + 0x12));
    (**(code **)(*in_RDI + 0xa8))();
    NaVector::new_dim(pNVar5,uVar2);
    for (local_c = 0; uVar2 = (**(code **)(*in_RDI + 0xa8))(), local_c < uVar2;
        local_c = local_c + 1) {
      pNVar5 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
      iVar3 = (*pNVar5->_vptr_NaVector[8])(pNVar5,(ulong)local_c);
      NVar1 = *(NaReal *)CONCAT44(extraout_var,iVar3);
      in_stack_ffffffffffffffc8 = (NaPetriCnInput *)(in_RDI + 0x12);
      uVar2 = NaVector::dim((NaVector *)(in_RDI + 0x12));
      iVar3 = uVar2 + local_c;
      (**(code **)(*in_RDI + 0xa8))();
      pNVar6 = NaVector::operator[]
                         ((NaVector *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                          (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *pNVar6 = NVar1;
    }
  }
  return;
}

Assistant:

void
NaPNQueueOutput::action ()
{
  unsigned	i;

  if(nQLimit > 0){
    vQueue.new_dim(vQueue.dim() + get_data_dim());

    for(i = 0; i < get_data_dim(); ++i){
      vQueue[vQueue.dim() + i - get_data_dim()] = in.data()[i];
    }
  }else for(i = 0; i < get_data_dim(); ++i){
    vQueue[i] = in.data()[i];
  }
}